

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O2

void __thiscall QSingleShotTimer::timerEvent(QSingleShotTimer *this,QTimerEvent *event)

{
  quint16 *this_00;
  bool bVar1;
  nanoseconds duration;
  QThread *this_01;
  QObject *parent;
  
  if (event->m_id == Invalid) {
    event[1].super_QEvent._vptr_QEvent = (_func_int **)0x0;
    this_00 = &event[1].super_QEvent.t;
    bVar1 = QDeadlineTimer::hasExpired((QDeadlineTimer *)this_00);
    if (!bVar1) {
      duration = QDeadlineTimer::remainingTimeAsDuration((QDeadlineTimer *)this_00);
      QBasicTimer::start((QBasicTimer *)(this + 0x10),(Duration)duration.__r,
                         (uint)(byte)event[1].field_0x14,(QObject *)this);
      this_01 = QThread::currentThread();
      parent = &QThread::eventDispatcher(this_01)->super_QObject;
      QObject::setParent((QObject *)this,parent);
      return;
    }
  }
  else {
    QBasicTimer::stop((QBasicTimer *)(this + 0x10));
  }
  timerFinished(this);
  return;
}

Assistant:

void QSingleShotTimer::timerEvent(QTimerEvent *event)
{
    if (event->id() == Qt::TimerId::Invalid) {
        StartTimerEvent *startTimerEvent = static_cast<StartTimerEvent *>(event);
        Q_UNUSED(startTimerEvent->timer.release()); // it's the same as "this"
        const QDeadlineTimer &deadline = startTimerEvent->deadline;
        if (deadline.hasExpired()) {
            timerFinished();
        } else {
            timer.start(deadline.remainingTimeAsDuration(), deadline.timerType(), this);
            // we are now definitely in a thread that has an event dispatcher
            setParent(QThread::currentThread()->eventDispatcher());
        }
    } else {
        // need to kill the timer _before_ we emit timeout() in case the
        // slot connected to timeout calls processEvents()
        timer.stop();

        timerFinished();
    }
}